

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O2

void __thiscall cmXMLWriter::Attribute<cmsys::String>(cmXMLWriter *this,char *name,String *value)

{
  ostream *poVar1;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  undefined8 uStack_20;
  
  PreAttribute(this);
  poVar1 = std::operator<<(this->Output,name);
  poVar1 = std::operator<<(poVar1,"=\"");
  std::__cxx11::string::string((string *)&local_58,(string *)value);
  local_38 = local_28;
  if (local_58 == local_48) {
    uStack_20 = uStack_40;
  }
  else {
    local_38 = local_58;
  }
  local_30 = local_50;
  local_50 = 0;
  local_48[0] = 0;
  local_58 = local_48;
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1,'\"');
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
    {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
    }